

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_muxer_metadata.cc
# Opt level: O2

bool __thiscall SampleMuxerMetadata::Write(SampleMuxerMetadata *this,int64_t time_ns)

{
  bool bVar1;
  _Base_ptr p_Var2;
  _Self __tmp;
  const_iterator __position;
  
  __position._M_node = (this->cues_set_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)__position._M_node ==
        &(this->cues_set_)._M_t._M_impl.super__Rb_tree_header) {
      return true;
    }
    if ((-1 < time_ns) &&
       (bVar1 = SortableCue::operator>((SortableCue *)(__position._M_node + 1),time_ns), bVar1))
    break;
    bVar1 = SortableCue::Write((SortableCue *)(__position._M_node + 1),this->segment_);
    if (!bVar1) {
      puts("\nCould not add metadata.");
      return false;
    }
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
    std::
    _Rb_tree<SampleMuxerMetadata::SortableCue,SampleMuxerMetadata::SortableCue,std::_Identity<SampleMuxerMetadata::SortableCue>,std::less<SampleMuxerMetadata::SortableCue>,std::allocator<SampleMuxerMetadata::SortableCue>>
    ::erase_abi_cxx11_((_Rb_tree<SampleMuxerMetadata::SortableCue,SampleMuxerMetadata::SortableCue,std::_Identity<SampleMuxerMetadata::SortableCue>,std::less<SampleMuxerMetadata::SortableCue>,std::allocator<SampleMuxerMetadata::SortableCue>>
                        *)&this->cues_set_,__position);
    __position._M_node = p_Var2;
  }
  return true;
}

Assistant:

bool SampleMuxerMetadata::Write(int64_t time_ns) {
  typedef cues_set_t::iterator iter_t;

  iter_t i = cues_set_.begin();
  const iter_t j = cues_set_.end();

  while (i != j) {
    const cues_set_t::value_type& v = *i;

    if (time_ns >= 0 && v > time_ns)
      return true;  // nothing else to do just yet

    if (!v.Write(segment_)) {
      printf("\nCould not add metadata.\n");
      return false;  // error
    }

    cues_set_.erase(i++);
  }

  return true;
}